

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O0

void duckdb::FilterSelectionSwitch<bool>
               (UnifiedVectorFormat *vdata,bool predicate,SelectionVector *sel,
               idx_t *approved_tuple_count,ExpressionType comparison_type)

{
  bool bVar1;
  idx_t iVar2;
  string *msg;
  idx_t *in_RCX;
  byte in_SIL;
  long in_RDI;
  undefined1 in_R8B;
  ValidityMask *mask;
  SelectionVector new_sel;
  SelectionVector *in_stack_fffffffffffffed8;
  SelectionVector *in_stack_fffffffffffffee0;
  allocator *this;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  SelectionVector *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  idx_t in_stack_ffffffffffffff18;
  SelectionVector *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2f;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  allocator local_79;
  string local_78 [48];
  TemplatedValidityMask<unsigned_long> *local_48;
  undefined1 local_21;
  idx_t *local_20;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_21 = in_R8B;
  local_20 = in_RCX;
  local_8 = in_RDI;
  SelectionVector::SelectionVector
            (in_stack_ffffffffffffff00,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
            );
  local_48 = (TemplatedValidityMask<unsigned_long> *)(local_8 + 0x10);
  switch(local_21) {
  case 0x19:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_48);
    if (bVar1) {
      iVar2 = TemplatedFilterSelection<bool,duckdb::Equals,false>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    else {
      iVar2 = TemplatedFilterSelection<bool,duckdb::Equals,true>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    break;
  case 0x1a:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_48);
    if (bVar1) {
      iVar2 = TemplatedFilterSelection<bool,duckdb::NotEquals,false>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    else {
      iVar2 = TemplatedFilterSelection<bool,duckdb::NotEquals,true>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    break;
  case 0x1b:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_48);
    if (bVar1) {
      iVar2 = TemplatedFilterSelection<bool,duckdb::LessThan,false>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    else {
      iVar2 = TemplatedFilterSelection<bool,duckdb::LessThan,true>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    break;
  case 0x1c:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_48);
    if (bVar1) {
      iVar2 = TemplatedFilterSelection<bool,duckdb::GreaterThan,false>
                        (in_stack_ffffffffffffff30,bVar1,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    else {
      iVar2 = TemplatedFilterSelection<bool,duckdb::GreaterThan,true>
                        (in_stack_ffffffffffffff30,bVar1,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    break;
  case 0x1d:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_48);
    if (bVar1) {
      iVar2 = TemplatedFilterSelection<bool,duckdb::LessThanEquals,false>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)CONCAT17(bVar1,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    else {
      iVar2 = TemplatedFilterSelection<bool,duckdb::LessThanEquals,true>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)CONCAT17(bVar1,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    break;
  case 0x1e:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_48);
    if (bVar1) {
      iVar2 = TemplatedFilterSelection<bool,duckdb::GreaterThanEquals,false>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    else {
      iVar2 = TemplatedFilterSelection<bool,duckdb::GreaterThanEquals,true>
                        (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         (SelectionVector *)
                         CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      *local_20 = iVar2;
    }
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this = &local_79;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_78,"Unknown comparison type for filter pushed down to table!",this);
    NotImplementedException::NotImplementedException((NotImplementedException *)this,msg);
    __cxa_throw(msg,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  SelectionVector::Initialize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  SelectionVector::~SelectionVector((SelectionVector *)0xb9d4cd);
  return;
}

Assistant:

static void FilterSelectionSwitch(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                  idx_t &approved_tuple_count, ExpressionType comparison_type) {
	SelectionVector new_sel(approved_tuple_count);
	auto &mask = vdata.validity;
	// the inplace loops take the result as the last parameter
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_NOTEQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, LessThanEquals, false>(vdata, predicate, sel,
			                                                                          approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThanEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, false>(vdata, predicate, sel,
			                                                                             approved_tuple_count, new_sel);
		} else {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, true>(vdata, predicate, sel,
			                                                                            approved_tuple_count, new_sel);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown comparison type for filter pushed down to table!");
	}
	sel.Initialize(new_sel);
}